

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O2

void PrintGameMenu(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1c28);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c3f);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c55);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c5f);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c69);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,anon_var_dwarf_1c73);
  return;
}

Assistant:

void PrintGameMenu()
{
    cout << "╔═════════════════════════════════════════════════════════════════"
            "═══════════════════════════════════════╗\n"
            "║•••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••"
            "•••••••••••••••••••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╔═════════════════════════════════════════"
            "═══════════════╗•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••║              Прогресс Прохождения "
            "Уровней              ║•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╟─────────────────────────────────────────"
            "───────────────╢•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••║              0 - не пройдено 1 - "
            "пройдено              ║•••••••••••••••••••••••║\n"
            "║•••••••••••••••••••••••╚═════════════════════════════════════════"
            "═══════════════╝•••••••••••••••••••••••║\n"
            "║••••••••••••╔═══════════════╤═══════════════╤═══════════════╤════"
            "═══════════╤═══════════════╗•••••••••••║\n"
            "║••••••••••••║               │               │               │    "
            "           │               ║•••••••••••║\n"
            "║••••••••••••║ Уровень 1 - "
         << selectionLevel[0] << " │ Уровень 2 - " << selectionLevel[1]
         << " │ Уровень 3 - " << selectionLevel[2] << " │ Уровень 4 - "
         << selectionLevel[3] << " │ Уровень 5 - " << selectionLevel[4]
         << " ║•••••••••••║\n"
            "║••••••••••••║               │               │               │    "
            "           │               ║•••••••••••║\n"
            "║••••••••••••╚═══════════════╧═══════════════╧═══════════════╧════"
            "═══════════╧═══════════════╝•••••••••••║\n"
            "║•••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••••"
            "•••••••••••••••••••••••••••••••••••••••║\n"
            "╚═════════════════════════════════════════════════════════════════"
            "═══════════════════════════════════════╝\n";
}